

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

Matrix * __thiscall sptk::Matrix::operator=(Matrix *this,Matrix *matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (this != matrix) {
    iVar1 = matrix->num_column_;
    this->num_row_ = matrix->num_row_;
    this->num_column_ = iVar1;
    std::vector<double,_std::allocator<double>_>::operator=(&this->data_,&matrix->data_);
    std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_row_);
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      iVar2 = this->num_column_;
      lVar3 = 0;
      lVar4 = 0;
      do {
        (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] =
             (double *)
             ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar3);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + (long)iVar2 * 8;
      } while (iVar1 != lVar4);
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& matrix) {
  if (this != &matrix) {
    num_row_ = matrix.num_row_;
    num_column_ = matrix.num_column_;
    data_ = matrix.data_;
    index_.resize(num_row_);

    for (int i(0); i < num_row_; ++i) {
      index_[i] = &data_[i * num_column_];
    }
  }
  return *this;
}